

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mojoshader_effects.c
# Opt level: O0

void readannotations(uint32 numannos,uint8 *base,uint8 **ptr,uint32 *len,
                    MOJOSHADER_effectAnnotation **annotations,MOJOSHADER_effectObject *objects,
                    MOJOSHADER_malloc m,void *d)

{
  uint32 typeoffset_00;
  uint32 valoffset_00;
  MOJOSHADER_effectAnnotation *pMVar1;
  uint32 valoffset;
  uint32 typeoffset;
  MOJOSHADER_effectAnnotation *anno;
  uint32 siz;
  int i;
  MOJOSHADER_effectObject *objects_local;
  MOJOSHADER_effectAnnotation **annotations_local;
  uint32 *len_local;
  uint8 **ptr_local;
  uint8 *base_local;
  uint32 numannos_local;
  
  if (numannos != 0) {
    pMVar1 = (MOJOSHADER_effectAnnotation *)(*m)(numannos << 6,d);
    *annotations = pMVar1;
    memset(*annotations,0,(ulong)(numannos << 6));
    for (anno._4_4_ = 0; anno._4_4_ < numannos; anno._4_4_ = anno._4_4_ + 1) {
      pMVar1 = *annotations;
      typeoffset_00 = readui32(ptr,len);
      valoffset_00 = readui32(ptr,len);
      readvalue(base,typeoffset_00,valoffset_00,pMVar1 + (int)anno._4_4_,objects,m,d);
    }
  }
  return;
}

Assistant:

static void readannotations(const uint32 numannos,
                            const uint8 *base,
                            const uint8 **ptr,
                            uint32 *len,
                            MOJOSHADER_effectAnnotation **annotations,
                            MOJOSHADER_effectObject *objects,
                            MOJOSHADER_malloc m,
                            void *d)
{
    int i;
    if (numannos == 0) return;

    const uint32 siz = sizeof(MOJOSHADER_effectAnnotation) * numannos;
    *annotations = (MOJOSHADER_effectAnnotation *) m(siz, d);
    memset(*annotations, '\0', siz);

    for (i = 0; i < numannos; i++)
    {
        MOJOSHADER_effectAnnotation *anno = &(*annotations)[i];

        const uint32 typeoffset = readui32(ptr, len);
        const uint32 valoffset = readui32(ptr, len);

        readvalue(base, typeoffset, valoffset,
                  anno, objects,
                  m, d);
    } // for
}